

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  tftp_state_data *state_00;
  _Bool *data_00;
  timediff_t tVar1;
  int *piVar2;
  char *pcVar3;
  char local_148 [8];
  char buffer [256];
  int error;
  int rc;
  timediff_t timeout_ms;
  tftp_state_data *state;
  connectdata *conn;
  CURLcode result;
  tftp_event_t event;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._0_4_ = CURLE_OK;
  state_00 = (data->conn->proto).tftpc;
  _result = done;
  done_local = (_Bool *)data;
  tVar1 = tftp_state_timeout(data,(tftp_event_t *)((long)&conn + 4));
  *_result = false;
  if (tVar1 < 0) {
    Curl_failf((Curl_easy *)done_local,"TFTP response timeout");
    data_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (conn._4_4_ == TFTP_EVENT_NONE) {
      buffer._252_4_ = Curl_socket_check(state_00->sockfd,-1,-1,0);
      if (buffer._252_4_ == -1) {
        piVar2 = __errno_location();
        data_00 = done_local;
        buffer._248_4_ = *piVar2;
        pcVar3 = Curl_strerror(buffer._248_4_,local_148,0x100);
        Curl_failf((Curl_easy *)data_00,"%s",pcVar3);
        state_00->event = TFTP_EVENT_ERROR;
      }
      else if (buffer._252_4_ != 0) {
        conn._0_4_ = tftp_receive_packet((Curl_easy *)done_local);
        if ((CURLcode)conn != CURLE_OK) {
          return (CURLcode)conn;
        }
        conn._0_4_ = tftp_state_machine(state_00,state_00->event);
        if ((CURLcode)conn != CURLE_OK) {
          return (CURLcode)conn;
        }
        *_result = state_00->state == TFTP_STATE_FIN;
        if ((*_result & 1U) != 0) {
          Curl_xfer_setup_nop((Curl_easy *)done_local);
        }
      }
    }
    else {
      conn._0_4_ = tftp_state_machine(state_00,conn._4_4_);
      if ((CURLcode)conn != CURLE_OK) {
        return (CURLcode)conn;
      }
      *_result = state_00->state == TFTP_STATE_FIN;
      if ((*_result & 1U) != 0) {
        Curl_xfer_setup_nop((Curl_easy *)done_local);
      }
    }
    data_local._4_4_ = (CURLcode)conn;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN);
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN);
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}